

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_stability_check.cc
# Opt level: O0

bool __thiscall
sptk::LinearPredictiveCoefficientsStabilityCheck::Run
          (LinearPredictiveCoefficientsStabilityCheck *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *modified_linear_predictive_coefficients,
          bool *is_stable,Buffer *buffer)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  undefined1 *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  long in_R8;
  double dVar6;
  Buffer *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  ParcorCoefficientsToLinearPredictiveCoefficients *in_stack_00000018;
  int m;
  double bound;
  double *parcor_coefficients;
  value_type local_60;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar7;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  bool local_1;
  
  if (((((*(byte *)(in_RDI + 0x48) & 1) == 0) ||
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 != (long)(*(int *)(in_RDI + 8) + 1))) || (in_RCX == (undefined1 *)0x0)) || (in_R8 == 0)
     ) {
    local_1 = false;
  }
  else {
    if ((in_RDX != (vector<double,_std::allocator<double>_> *)0x0) &&
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
       sVar3 != (long)(*(int *)(in_RDI + 8) + 1))) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffc0,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    *in_RCX = 1;
    if (*(int *)(in_RDI + 8) == 0) {
      if (in_RDX != (vector<double,_std::allocator<double>_> *)0x0) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
        vVar1 = *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
        *pvVar5 = vVar1;
      }
      local_1 = true;
    }
    else {
      bVar2 = LinearPredictiveCoefficientsToParcorCoefficients::Run
                        ((LinearPredictiveCoefficientsToParcorCoefficients *)this,
                         linear_predictive_coefficients,modified_linear_predictive_coefficients,
                         is_stable,(Buffer *)buffer);
      if (bVar2) {
        if (in_RDX != (vector<double,_std::allocator<double>_> *)0x0) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x48),0);
          dVar6 = 1.0 - *(double *)(in_RDI + 0x10);
          for (iVar7 = 1; iVar7 <= *(int *)(in_RDI + 8); iVar7 = iVar7 + 1) {
            if (dVar6 < ABS(pvVar5[iVar7])) {
              local_60 = dVar6;
              if (pvVar5[iVar7] <= 0.0) {
                local_60 = -dVar6;
              }
              pvVar5[iVar7] = local_60;
            }
          }
          bVar2 = ParcorCoefficientsToLinearPredictiveCoefficients::Run
                            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
          if (!bVar2) {
            return false;
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool LinearPredictiveCoefficientsStabilityCheck::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* modified_linear_predictive_coefficients,
    bool* is_stable,
    LinearPredictiveCoefficientsStabilityCheck::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == is_stable || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (NULL != modified_linear_predictive_coefficients &&
      modified_linear_predictive_coefficients->size() !=
          static_cast<std::size_t>(num_order_ + 1)) {
    modified_linear_predictive_coefficients->resize(num_order_ + 1);
  }

  // Handle a special case.
  *is_stable = true;
  if (0 == num_order_) {
    if (NULL != modified_linear_predictive_coefficients) {
      (*modified_linear_predictive_coefficients)[0] =
          linear_predictive_coefficients[0];
    }
    return true;
  }

  // Check stability.
  if (!linear_predictive_coefficients_to_parcor_coefficients_.Run(
          linear_predictive_coefficients, &buffer->parcor_coefficients_,
          is_stable, &buffer->conversion_buffer_)) {
    return false;
  }

  // Perform modification.
  if (NULL != modified_linear_predictive_coefficients) {
    double* parcor_coefficients(&buffer->parcor_coefficients_[0]);
    const double bound(1.0 - margin_);
    for (int m(1); m <= num_order_; ++m) {
      if (bound < std::fabs(parcor_coefficients[m])) {
        parcor_coefficients[m] =
            (0.0 < parcor_coefficients[m]) ? bound : -bound;
      }
    }
    if (!parcor_coefficients_to_linear_predictive_coefficients_.Run(
            buffer->parcor_coefficients_,
            modified_linear_predictive_coefficients,
            &buffer->reconversion_buffer_)) {
      return false;
    }
  }

  return true;
}